

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this,char *dir)

{
  vector<int,_std::allocator<int>_> *this_00;
  cmCTest *pcVar1;
  bool bVar2;
  LabelSet *pLVar3;
  byte bVar4;
  bool bVar5;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar6;
  char *pcVar7;
  ostream *poVar8;
  ulong uVar9;
  set<int,std::less<int>,std::allocator<int>> *this_01;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  LabelSet *labelSet;
  _Base_ptr local_4d0;
  undefined1 local_4c8;
  _Base_ptr local_4c0;
  undefined1 local_4b8;
  int local_4ac;
  undefined1 local_4a8 [4];
  int id;
  string label;
  vector<int,_std::allocator<int>_> targetLabels;
  string line;
  string source;
  string local_428 [7];
  bool inTarget;
  undefined1 local_408 [8];
  ostringstream cmCTestLog_msg;
  long local_288;
  ifstream fin;
  allocator local_79;
  string local_78 [8];
  string fname;
  allocator local_41;
  key_type local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_20;
  LabelSet *dirLabels;
  char *dir_local;
  cmCTestCoverageHandler *this_local;
  
  dirLabels = (LabelSet *)dir;
  dir_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,dir,&local_41);
  psVar6 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
            ::operator[](&this->TargetDirs,&local_40)->
            super_set<int,_std::less<int>,_std::allocator<int>_>;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pLVar3 = dirLabels;
  local_20 = psVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,(char *)pLVar3,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::operator+=(local_78,"/Labels.txt");
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_288,pcVar7,_S_in);
  bVar4 = std::ios::operator!((ios *)((long)&local_288 + *(long *)(local_288 + -0x18)));
  if ((bVar4 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    poVar8 = std::operator<<((ostream *)local_408," loading labels from [");
    poVar8 = std::operator<<(poVar8,local_78);
    std::operator<<(poVar8,"]\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x8a9,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_428);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    bVar2 = true;
    std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8));
    while (bVar5 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_288,
                              (string *)
                              &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(bool *)0x0,-1), bVar5) {
      uVar9 = std::__cxx11::string::empty();
      if (((uVar9 & 1) == 0) &&
         (pcVar7 = (char *)std::__cxx11::string::operator[]
                                     ((ulong)&targetLabels.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage),
         *pcVar7 != '#')) {
        pcVar7 = (char *)std::__cxx11::string::operator[]
                                   ((ulong)&targetLabels.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage);
        if (*pcVar7 == ' ') {
          std::__cxx11::string::substr
                    ((ulong)local_4a8,
                     (ulong)&targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          local_4ac = GetLabelId(this,(string *)local_4a8);
          pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(local_20,&local_4ac);
          local_4c0 = (_Base_ptr)pVar10.first._M_node;
          local_4b8 = pVar10.second;
          if (bVar2) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8),&local_4ac);
          }
          else {
            psVar6 = &std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                      ::operator[](&this->SourceLabels,(key_type *)((long)&line.field_2 + 8))->
                      super_set<int,_std::less<int>,_std::allocator<int>_>;
            pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(psVar6,&local_4ac);
            local_4d0 = (_Base_ptr)pVar10.first._M_node;
            local_4c8 = pVar10.second;
          }
          std::__cxx11::string::~string((string *)local_4a8);
        }
        else {
          bVar2 = false;
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::GetShortPathToFile_abi_cxx11_((string *)&labelSet,pcVar1,pcVar7);
          std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),(string *)&labelSet);
          std::__cxx11::string::~string((string *)&labelSet);
          this_01 = (set<int,std::less<int>,std::allocator<int>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                    ::operator[](&this->SourceLabels,(key_type *)(line.field_2._M_local_buf + 8));
          this_00 = (vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8);
          __first = std::vector<int,_std::allocator<int>_>::begin(this_00);
          __last = std::vector<int,_std::allocator<int>_>::end(this_00);
          std::set<int,std::less<int>,std::allocator<int>>::
          insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (this_01,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             __first._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __last._M_current);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  }
  std::ifstream::~ifstream(&local_288);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels(const char* dir)
{
  LabelSet& dirLabels = this->TargetDirs[dir];
  std::string fname = dir;
  fname += "/Labels.txt";
  cmsys::ifstream fin(fname.c_str());
  if (!fin) {
    return;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " loading labels from [" << fname << "]\n", this->Quiet);
  bool inTarget = true;
  std::string source;
  std::string line;
  std::vector<int> targetLabels;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty() || line[0] == '#') {
      // Ignore blank and comment lines.
      continue;
    }
    if (line[0] == ' ') {
      // Label lines appear indented by one space.
      std::string label = line.substr(1);
      int id = this->GetLabelId(label);
      dirLabels.insert(id);
      if (inTarget) {
        targetLabels.push_back(id);
      } else {
        this->SourceLabels[source].insert(id);
      }
    } else {
      // Non-indented lines specify a source file name.  The first one
      // is the end of the target-wide labels.
      inTarget = false;

      source = this->CTest->GetShortPathToFile(line.c_str());

      // Label the source with the target labels.
      LabelSet& labelSet = this->SourceLabels[source];
      labelSet.insert(targetLabels.begin(), targetLabels.end());
    }
  }
}